

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ldscript.c
# Opt level: O1

int sf_loadaddr(GlobalVars *gv,lword addr,lword *res)

{
  bool bVar1;
  LinkedSection *pLVar2;
  
  bVar1 = startofblock('(');
  if (bVar1 != 0) {
    pLVar2 = getsection(gv);
    if (pLVar2 != (LinkedSection *)0x0) {
      *res = pLVar2->copybase;
    }
    endofblock('(',')');
  }
  return 1;
}

Assistant:

static int sf_loadaddr(struct GlobalVars *gv,lword addr,lword *res)
{
  struct LinkedSection *ls;

  if (startofblock('(')) {
    if (ls = getsection(gv))
      *res = ls->copybase;
    endofblock('(',')');
  }
  return 1;
}